

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9Texture.cpp
# Opt level: O2

uint32_t __thiscall
GmmLib::GmmGen9TextureCalc::Get2DMipMapHeight(GmmGen9TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  anon_struct_8_44_94931171_for_Info aVar1;
  anon_struct_8_45_9b07292e_for_Gpu aVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  uint uVar6;
  GMM_PLATFORM_INFO *pGVar7;
  uint uVar8;
  uint uVar9;
  uint32_t local_60;
  uint32_t local_5c;
  uint32_t CompressWidth;
  uint32_t CompressDepth;
  ulong local_50;
  GMM_PLATFORM_INFO *local_48;
  uint32_t local_3c;
  uint local_38;
  uint8_t local_31;
  uint32_t CompressHeight;
  
  pGVar7 = GmmGetPlatformInfo((this->super_GmmTextureCalc).pGmmLibContext);
  local_31 = GmmIsCompressed((this->super_GmmTextureCalc).pGmmLibContext,pTexInfo->Format);
  uVar3 = pTexInfo->BaseHeight;
  local_3c = pTexInfo->MaxLod;
  uVar6 = (pTexInfo->Alignment).VAlign;
  GmmTextureCalc::GetCompressionBlockDimensions
            (&this->super_GmmTextureCalc,pTexInfo->Format,&local_60,&local_38,&local_5c);
  if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) == 0) {
    uVar5 = 1;
  }
  else {
    uVar5 = (pTexInfo->MSAA).NumSamples;
  }
  uVar3 = GmmTextureCalc::ExpandHeight(&this->super_GmmTextureCalc,uVar3,uVar6,uVar5);
  if (local_31 == '\0') {
    aVar2 = (pTexInfo->Flags).Gpu;
    if (((aVar2._0_4_ >> 0x1d & 1) == 0) || (((pTexInfo->Flags).Info.field_0x4 & 4) == 0)) {
      _CompressWidth = (ulong)(uVar3 >> 4);
      if ((~(ulong)aVar2 & 0x20000000002) != 0) {
        _CompressWidth = (ulong)uVar3;
      }
      goto LAB_001b19ae;
    }
    uVar4 = uVar3 >> 1;
  }
  else {
    uVar4 = uVar3 / local_38;
  }
  _CompressWidth = (ulong)uVar4;
LAB_001b19ae:
  if ((((pTexInfo->Flags).Info.field_0x4 & 0x60) == 0) ||
     (((pTexInfo->Alignment).MipTailStartLod != 0 && (pTexInfo->MaxLod != 0)))) {
    uVar9 = 0;
    uVar8 = 0;
    local_50 = (ulong)uVar6;
    local_48 = pGVar7;
    for (uVar4 = 1; aVar1 = (pTexInfo->Flags).Info, uVar4 <= local_3c; uVar4 = uVar4 + 1) {
      if ((((ulong)aVar1 & 0x6000000000) != 0) && (uVar4 == (pTexInfo->Alignment).MipTailStartLod))
      {
        uVar3 = local_48->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        if (uVar4 == 1) {
          uVar8 = uVar3;
          uVar3 = 0;
        }
        uVar9 = uVar9 + uVar3;
        break;
      }
      uVar5 = (*(this->super_GmmTextureCalc)._vptr_GmmTextureCalc[0x19])(this,pTexInfo,(ulong)uVar4)
      ;
      uVar3 = 1;
      if (((ulong)(pTexInfo->Flags).Gpu & 0x20000040) != 0) {
        uVar3 = (pTexInfo->MSAA).NumSamples;
      }
      uVar3 = GmmTextureCalc::ExpandHeight
                        (&this->super_GmmTextureCalc,uVar5,(uint32_t)local_50,uVar3);
      if (local_31 == '\0') {
        aVar2 = (pTexInfo->Flags).Gpu;
        if (((aVar2._0_4_ >> 0x1d & 1) == 0) || (((ulong)(pTexInfo->Flags).Info & 0x400000000) == 0)
           ) {
          uVar6 = uVar3 >> 4;
          if ((~(ulong)aVar2 & 0x20000000002) != 0) {
            uVar6 = uVar3;
          }
        }
        else {
          uVar6 = uVar3 >> 1;
        }
      }
      else {
        uVar6 = uVar3 / local_38;
      }
      uVar3 = uVar6;
      if (uVar4 == 1) {
        uVar3 = 0;
        uVar8 = uVar6;
      }
      uVar9 = uVar9 + uVar3;
    }
    if (((ulong)aVar1 & 0x6000000000) == 0) {
      if (uVar8 < uVar9) {
        uVar8 = uVar9;
      }
      _CompressWidth = (ulong)((int)_CompressWidth + ((int)local_50 + -1 + uVar8 & -(int)local_50));
    }
    else {
      if (uVar9 < uVar8) {
        uVar9 = uVar8;
      }
      uVar3 = local_48->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      _CompressWidth = (ulong)(-uVar3 & (uVar3 - 1) + (int)_CompressWidth + uVar9);
    }
  }
  return (uint32_t)_CompressWidth;
}

Assistant:

uint32_t GmmLib::GmmGen9TextureCalc::Get2DMipMapHeight(GMM_TEXTURE_INFO *pTexInfo)
{
    uint32_t BlockHeight, MipHeight;
    uint32_t HeightLinesLevel0, HeightLinesLevel1, HeightLinesLevel2;
    uint32_t i, MipLevel, VAlign, CompressHeight, CompressWidth, CompressDepth;
    uint8_t  Compressed;
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    Compressed = GmmIsCompressed(pGmmLibContext, pTexInfo->Format);
    MipHeight  = pTexInfo->BaseHeight;
    MipLevel   = pTexInfo->MaxLod;
    VAlign     = pTexInfo->Alignment.VAlign;
    GetCompressionBlockDimensions(pTexInfo->Format, &CompressWidth, &CompressHeight, &CompressDepth);

    HeightLinesLevel0 = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

    if(Compressed)
    {
        HeightLinesLevel0 /= CompressHeight;
    }
    else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
    {
        HeightLinesLevel0 /= 2;
    }
    else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        HeightLinesLevel0 /= 16;
    }

    // Mip0 height...
    BlockHeight = HeightLinesLevel0;

    if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
       ((pTexInfo->Alignment.MipTailStartLod == 0) || (pTexInfo->MaxLod == 0)))
    {
        // Do nothing. Height is already aligned.
    }
    else
    {
        // Height of Mip1 and Mip2..n needed later...
        HeightLinesLevel1 = HeightLinesLevel2 = 0;
        for(i = 1; i <= MipLevel; i++)
        {
            uint32_t AlignedHeightLines;

            if((pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs) &&
               (i == pTexInfo->Alignment.MipTailStartLod))
            {
                AlignedHeightLines = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }

                break;
            }
            else
            {
                MipHeight = GmmTexGetMipHeight(pTexInfo, i);

                AlignedHeightLines = __GMM_EXPAND_HEIGHT(this, MipHeight, VAlign, pTexInfo);

                if(Compressed)
                {
                    AlignedHeightLines /= CompressHeight;
                }
                else if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
                {
                    AlignedHeightLines /= 2;
                }
                else if(pTexInfo->Flags.Gpu.CCS && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
                {
                    AlignedHeightLines /= 16;
                }

                if(i == 1)
                {
                    HeightLinesLevel1 = AlignedHeightLines;
                }
                else
                {
                    HeightLinesLevel2 += AlignedHeightLines;
                }
            }
        }

        // If Mip1 height covers all others, then that is all we need...
        if(!(pTexInfo->Flags.Info.TiledYf || pTexInfo->Flags.Info.TiledYs))
        {
            if(HeightLinesLevel1 >= HeightLinesLevel2)
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel1, VAlign);
            }
            else
            {
                BlockHeight += GFX_ALIGN(HeightLinesLevel2, VAlign);
            }
        }
        else
        {
            //TR mode- requires TileMode height alignment
            BlockHeight += (HeightLinesLevel1 >= HeightLinesLevel2) ? HeightLinesLevel1 : HeightLinesLevel2;
            BlockHeight = GFX_ALIGN(BlockHeight, pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight);
        }
    }

    GMM_DPF_EXIT;

    return (BlockHeight);
}